

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

string * google::protobuf::internal::GetTypeUrl_abi_cxx11_
                   (StringPiece message_name,StringPiece type_url_prefix)

{
  StringPiece str;
  StringPiece str_00;
  StringPiece str_01;
  StringPiece str_02;
  bool bVar1;
  char cVar2;
  stringpiece_ssize_type sVar3;
  stringpiece_ssize_type in_RDX;
  char *in_RSI;
  AlphaNum *in_RDI;
  AlphaNum *this;
  char *in_stack_fffffffffffffea8;
  stringpiece_ssize_type in_stack_fffffffffffffeb0;
  AlphaNum *in_stack_ffffffffffffff40;
  AlphaNum *in_stack_ffffffffffffff48;
  AlphaNum *in_stack_ffffffffffffff58;
  AlphaNum *in_stack_ffffffffffffff60;
  AlphaNum *in_stack_ffffffffffffff68;
  StringPiece local_28;
  char *local_18;
  stringpiece_ssize_type local_10;
  
  this = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDX;
  bVar1 = StringPiece::empty(&local_28);
  if (!bVar1) {
    sVar3 = StringPiece::size(&local_28);
    cVar2 = StringPiece::operator[](&local_28,sVar3 + -1);
    if (cVar2 == '/') {
      str.length_ = in_stack_fffffffffffffeb0;
      str.ptr_ = in_stack_fffffffffffffea8;
      strings::AlphaNum::AlphaNum(this,str);
      str_00.length_ = in_stack_fffffffffffffeb0;
      str_00.ptr_ = in_stack_fffffffffffffea8;
      strings::AlphaNum::AlphaNum(this,str_00);
      StrCat_abi_cxx11_(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      return (string *)this;
    }
  }
  str_01.length_ = in_stack_fffffffffffffeb0;
  str_01.ptr_ = in_stack_fffffffffffffea8;
  strings::AlphaNum::AlphaNum(this,str_01);
  strings::AlphaNum::AlphaNum(this,(char *)in_RDI);
  str_02.length_ = local_10;
  str_02.ptr_ = local_18;
  strings::AlphaNum::AlphaNum(this,str_02);
  StrCat_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return (string *)this;
}

Assistant:

std::string GetTypeUrl(StringPiece message_name,
                       StringPiece type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return StrCat(type_url_prefix, message_name);
  } else {
    return StrCat(type_url_prefix, "/", message_name);
  }
}